

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprCode(Parse *pParse,Expr *pExpr,int target)

{
  uint uVar1;
  int p1;
  int op;
  ExprList_item *pEVar2;
  
  if (pParse->pVdbe != (Vdbe *)0x0) {
    p1 = sqlite3ExprCodeTarget(pParse,pExpr,target);
    if (p1 != target) {
      do {
        if (pExpr == (Expr *)0x0) {
LAB_0016b09f:
          op = 0x51;
LAB_0016b0a4:
          sqlite3VdbeAddOp3(pParse->pVdbe,op,p1,target,0);
          return;
        }
        uVar1 = pExpr->flags;
        if ((uVar1 & 0x82000) == 0) {
LAB_0016b08e:
          op = 0x50;
          if (((uVar1 >> 0x16 & 1) != 0) || (pExpr->op == 0xb0)) goto LAB_0016b0a4;
          goto LAB_0016b09f;
        }
        if ((uVar1 >> 0x13 & 1) == 0) {
          if (pExpr->op != 'q') goto LAB_0016b08e;
          pEVar2 = (ExprList_item *)&pExpr->pLeft;
        }
        else {
          pEVar2 = ((pExpr->x).pList)->a;
        }
        pExpr = pEVar2->pExpr;
      } while( true );
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCode(Parse *pParse, Expr *pExpr, int target){
  int inReg;

  assert( pExpr==0 || !ExprHasVVAProperty(pExpr,EP_Immutable) );
  assert( target>0 && target<=pParse->nMem );
  assert( pParse->pVdbe!=0 || pParse->db->mallocFailed );
  if( pParse->pVdbe==0 ) return;
  inReg = sqlite3ExprCodeTarget(pParse, pExpr, target);
  if( inReg!=target ){
    u8 op;
    Expr *pX = sqlite3ExprSkipCollateAndLikely(pExpr);
    testcase( pX!=pExpr );
    if( ALWAYS(pX)
     && (ExprHasProperty(pX,EP_Subquery) || pX->op==TK_REGISTER)
    ){
      op = OP_Copy;
    }else{
      op = OP_SCopy;
    }
    sqlite3VdbeAddOp2(pParse->pVdbe, op, inReg, target);
  }
}